

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::STLImporter::pushMeshesToNode
          (STLImporter *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *meshIndices,
          aiNode *node)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  uint *puVar5;
  reference pvVar6;
  ulong local_28;
  size_t i;
  aiNode *node_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *meshIndices_local;
  STLImporter *this_local;
  
  if (node == (aiNode *)0x0) {
    __assert_fail("nullptr != node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/STL/STLLoader.cpp"
                  ,0x239,
                  "void Assimp::STLImporter::pushMeshesToNode(std::vector<unsigned int> &, aiNode *)"
                 );
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(meshIndices);
  if (!bVar2) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(meshIndices);
    node->mNumMeshes = (uint)sVar3;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(meshIndices);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar5 = (uint *)operator_new__(uVar4);
    node->mMeshes = puVar5;
    for (local_28 = 0;
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(meshIndices),
        local_28 < sVar3; local_28 = local_28 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (meshIndices,local_28);
      node->mMeshes[local_28] = *pvVar6;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(meshIndices);
  }
  return;
}

Assistant:

void STLImporter::pushMeshesToNode( std::vector<unsigned int> &meshIndices, aiNode *node ) {
    ai_assert( nullptr != node );
    if ( meshIndices.empty() ) {
        return;
    }

    node->mNumMeshes = static_cast<unsigned int>( meshIndices.size() );
    node->mMeshes = new unsigned int[ meshIndices.size() ];
    for ( size_t i=0; i<meshIndices.size(); ++i ) {
        node->mMeshes[ i ] = meshIndices[ i ];
    }
    meshIndices.clear();
}